

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

vertex_index tinyobj::parseRawTriple(char **token)

{
  vertex_index vVar1;
  size_t sVar2;
  char **token_local;
  int iStack_10;
  vertex_index vi;
  
  vertex_index::vertex_index((vertex_index *)((long)&token_local + 4),0);
  token_local._4_4_ = atoi(*token);
  sVar2 = strcspn(*token,"/ \t\r");
  *token = *token + sVar2;
  if (**token == '/') {
    *token = *token + 1;
    if (**token == '/') {
      *token = *token + 1;
      vi.v_idx = atoi(*token);
      sVar2 = strcspn(*token,"/ \t\r");
      *token = *token + sVar2;
    }
    else {
      iStack_10 = atoi(*token);
      sVar2 = strcspn(*token,"/ \t\r");
      *token = *token + sVar2;
      if (**token == '/') {
        *token = *token + 1;
        vi.v_idx = atoi(*token);
        sVar2 = strcspn(*token,"/ \t\r");
        *token = *token + sVar2;
      }
    }
  }
  vVar1.vt_idx = iStack_10;
  vVar1.v_idx = token_local._4_4_;
  vVar1.vn_idx = vi.v_idx;
  return vVar1;
}

Assistant:

static vertex_index parseRawTriple(const char **token) {
  vertex_index vi(static_cast<int>(0));  // 0 is an invalid index in OBJ

  vi.v_idx = atoi((*token));
  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    return vi;
  }
  (*token)++;

  // i//k
  if ((*token)[0] == '/') {
    (*token)++;
    vi.vn_idx = atoi((*token));
    (*token) += strcspn((*token), "/ \t\r");
    return vi;
  }

  // i/j/k or i/j
  vi.vt_idx = atoi((*token));
  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    return vi;
  }

  // i/j/k
  (*token)++;  // skip '/'
  vi.vn_idx = atoi((*token));
  (*token) += strcspn((*token), "/ \t\r");
  return vi;
}